

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

void __thiscall
duckdb::GeoParquetFileMetadata::RegisterGeometryColumn
          (GeoParquetFileMetadata *this,string *column_name)

{
  mapped_type *this_00;
  GeoParquetColumnMetadata local_88;
  
  ::std::mutex::lock(&this->write_lock);
  if ((this->primary_geometry_column)._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->primary_geometry_column);
  }
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.projjson._M_string_length = 0;
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.geometry_encoding = 0;
  local_88._1_7_ = 0;
  local_88.geometry_types._M_t._M_impl._0_8_ = 0;
  local_88.projjson.field_2._8_8_ = 0;
  local_88.bbox.min_x = 1.79769313486232e+308;
  local_88.bbox.max_x = -1.79769313486232e+308;
  local_88.bbox.min_y = 1.79769313486232e+308;
  local_88.bbox.max_y = -1.79769313486232e+308;
  local_88.projjson._M_dataplus._M_p = (pointer)&local_88.projjson.field_2;
  local_88.projjson.field_2._M_allocated_capacity = 0;
  local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.geometry_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = ::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->geometry_columns,column_name);
  GeoParquetColumnMetadata::operator=(this_00,&local_88);
  GeoParquetColumnMetadata::~GeoParquetColumnMetadata(&local_88);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void GeoParquetFileMetadata::RegisterGeometryColumn(const string &column_name) {
	lock_guard<mutex> glock(write_lock);
	if (primary_geometry_column.empty()) {
		primary_geometry_column = column_name;
	}
	geometry_columns[column_name] = GeoParquetColumnMetadata();
}